

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  BYTE BVar1;
  U16 UVar2;
  U32 UVar3;
  byte bVar4;
  ushort uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  U32 UVar9;
  uint uVar10;
  U32 n;
  BYTE BVar11;
  size_t sStackY_1c0;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [16];
  BYTE huffWeight [256];
  
  tableLog = 0;
  nbSymbols = 0;
  sStackY_1c0 = HUF_readStats(huffWeight,0x100,rankVal,&nbSymbols,&tableLog,src,srcSize);
  if (sStackY_1c0 < 0xffffffffffffff89) {
    uVar7 = (ulong)tableLog;
    if (uVar7 < 0xd) {
      uVar8 = (ulong)nbSymbols;
      if (*maxSymbolValuePtr + 1 < nbSymbols) {
        sStackY_1c0 = 0xffffffffffffffd0;
      }
      else {
        UVar9 = 0;
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          UVar3 = rankVal[uVar6 + 1];
          bVar4 = (byte)uVar6;
          rankVal[uVar6 + 1] = UVar9;
          UVar9 = (UVar3 << (bVar4 & 0x1f)) + UVar9;
        }
        *hasZeroWeights = 0;
        uVar10 = 0;
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          BVar1 = huffWeight[uVar6];
          BVar11 = ((char)tableLog + '\x01') - BVar1;
          if (BVar1 == '\0') {
            BVar11 = '\0';
          }
          uVar10 = uVar10 | BVar1 == '\0';
          *hasZeroWeights = uVar10;
          CTable[uVar6].nbBits = BVar11;
        }
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0xd] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank[8] = 0;
        valPerRank[9] = 0;
        valPerRank[10] = 0;
        valPerRank[0xb] = 0;
        valPerRank[0xc] = 0;
        valPerRank[0xd] = 0;
        valPerRank[0] = 0;
        valPerRank[1] = 0;
        valPerRank[2] = 0;
        valPerRank[3] = 0;
        valPerRank[4] = 0;
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          nbPerRank[CTable[uVar6].nbBits] = nbPerRank[CTable[uVar6].nbBits] + 1;
        }
        valPerRank[uVar7 + 1] = 0;
        uVar5 = 0;
        while (uVar7 != 0) {
          valPerRank[uVar7] = uVar5;
          uVar5 = (ushort)(uVar5 + nbPerRank[uVar7]) >> 1;
          uVar7 = uVar7 - 1;
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          UVar2 = valPerRank[CTable[uVar7].nbBits];
          valPerRank[CTable[uVar7].nbBits] = UVar2 + 1;
          CTable[uVar7].val = UVar2;
        }
        *maxSymbolValuePtr = nbSymbols - 1;
      }
    }
    else {
      sStackY_1c0 = 0xffffffffffffffd4;
    }
  }
  return sStackY_1c0;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill nbBits */
    *hasZeroWeights = 0;
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            *hasZeroWeights |= (w == 0);
            CTable[n].nbBits = (BYTE)(tableLog + 1 - w) & -(w != 0);
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[CTable[n].nbBits]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) CTable[n].val = valPerRank[CTable[n].nbBits]++; }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}